

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

void Cba_ManPrintDistribStat(Cba_Man_t *p,int *pCounts,int *pUserCounts)

{
  int iVar1;
  Cba_Ntk_t *pCVar2;
  char *pcVar3;
  int local_2c;
  int i;
  Cba_Ntk_t *pNtk;
  int *pUserCounts_local;
  int *pCounts_local;
  Cba_Man_t *p_local;
  
  pCVar2 = Cba_ManRoot(p);
  printf("Primitives:\n");
  for (local_2c = 0; local_2c < 0x5a; local_2c = local_2c + 1) {
    if (pCounts[local_2c] != 0) {
      pcVar3 = Cba_NtkTypeName(pCVar2,local_2c);
      printf("%-20s = %5d\n",pcVar3,(ulong)(uint)pCounts[local_2c]);
    }
  }
  printf("User hierarchy:\n");
  for (local_2c = 1; iVar1 = Cba_ManNtkNum(p), local_2c <= iVar1; local_2c = local_2c + 1) {
    pCVar2 = Cba_ManNtk(p,local_2c);
    if (pUserCounts[local_2c] != 0) {
      pcVar3 = Cba_NtkName(pCVar2);
      printf("%-20s = %5d\n",pcVar3,(ulong)(uint)pUserCounts[local_2c]);
    }
  }
  return;
}

Assistant:

void Cba_ManPrintDistribStat( Cba_Man_t * p, int * pCounts, int * pUserCounts )
{
    Cba_Ntk_t * pNtk = Cba_ManRoot(p); int i;
    printf( "Primitives:\n" );
    for ( i = 0; i < CBA_BOX_LAST; i++ )
        if ( pCounts[i] )
            printf( "%-20s = %5d\n", Cba_NtkTypeName(pNtk, i), pCounts[i] );
    printf( "User hierarchy:\n" );
    Cba_ManForEachNtk( p, pNtk, i )
        if ( pUserCounts[i] )
            printf( "%-20s = %5d\n", Cba_NtkName(pNtk), pUserCounts[i] );
}